

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O1

void __thiscall
TPZFrontNonSym<std::complex<float>_>::AddKel
          (TPZFrontNonSym<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *destinationindex)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  long lVar3;
  complex<float> *pcVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  lVar3 = destinationindex->fNElements;
  if (0 < lVar3) {
    lVar8 = 0;
    do {
      iVar5 = Local(this,destinationindex->fStore[lVar8]);
      lVar9 = 0;
      do {
        iVar6 = Local(this,destinationindex->fStore[lVar9]);
        if (((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar8) ||
           ((elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar9)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar7 = (long)(this->super_TPZFront<std::complex<float>_>).fMaxFront * (long)iVar6;
        pcVar4 = (this->super_TPZFront<std::complex<float>_>).fData.fStore;
        _Var1 = elmat->fElem
                [(elmat->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar9 +
                 lVar8]._M_value;
        _Var2 = pcVar4[lVar7 + iVar5]._M_value;
        pcVar4[lVar7 + iVar5]._M_value =
             CONCAT44((float)(_Var2 >> 0x20) + (float)(_Var1 >> 0x20),(float)_Var2 + (float)_Var1);
        lVar9 = lVar9 + 1;
      } while (lVar3 != lVar9);
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar3);
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
    int64_t i, j, ilocal, jlocal, nel;
    nel = destinationindex.NElements();
    for(i=0;i<nel;i++){
        ilocal = this->Local(destinationindex[i]);
		for(j=0;j<nel;j++) {
            jlocal=this->Local(destinationindex[j]);
            this->Element(ilocal, jlocal)+=elmat(i,j);
        }
    }
}